

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O0

int asio_service_test::try_adding_server
              (RaftAsioPkg *leader,RaftAsioPkg *srv_to_add,size_t count_limit)

{
  element_type *this;
  raft_server *in_RDX;
  bool bVar1;
  bool succeeded;
  string ret_string;
  ptr<cmd_result<ptr<buffer>_>_> ret;
  ptr<srv_config> s_conf;
  size_t ii;
  undefined4 in_stack_fffffffffffffef8;
  cmd_result_code in_stack_fffffffffffffefc;
  cmd_result_code in_stack_ffffffffffffff00;
  int32 in_stack_ffffffffffffff04;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this_00;
  string local_e0 [32];
  string local_c0 [12];
  int in_stack_ffffffffffffff4c;
  string local_98 [32];
  string local_78 [64];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd0;
  raft_server *this_01;
  int local_4;
  
  this_01 = (raft_server *)0x0;
  while( true ) {
    if (in_RDX <= this_01) {
      return -1;
    }
    RaftAsioPkg::getTestMgr((RaftAsioPkg *)0x1cb20e);
    this_00 = (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
              &stack0xffffffffffffffc8;
    raft_functional_common::TestMgr::get_srv_config
              ((TestMgr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1cb234);
    std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    nuraft::raft_server::add_srv(this_01,(srv_config *)in_stack_ffffffffffffffd0._M_pi);
    this = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1cb267);
    in_stack_ffffffffffffff04 = nuraft::srv_config::get_id(this);
    std::__cxx11::to_string(in_stack_ffffffffffffff4c);
    std::operator+((char *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string(local_98);
    std::
    __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1cb2bc);
    in_stack_ffffffffffffff00 =
         nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
         get_result_code(this_00);
    bVar1 = in_stack_ffffffffffffff00 != OK;
    if (bVar1) {
      std::
      __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1cb358);
      in_stack_fffffffffffffefc =
           nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
           get_result_code(this_00);
      std::__cxx11::to_string(in_stack_ffffffffffffff4c);
      std::operator+((char *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      std::__cxx11::string::operator+=(local_78,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_e0);
    }
    TestSuite::sleep_sec
              (CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (!bVar1) {
      local_4 = 0;
    }
    std::__cxx11::string::~string(local_78);
    std::
    shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
    ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                   *)0x1cb44d);
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1cb45a);
    if (!bVar1) break;
    this_01 = (raft_server *)((long)&this_01->_vptr_raft_server + 1);
  }
  return local_4;
}

Assistant:

int try_adding_server( RaftAsioPkg& leader,
                       const RaftAsioPkg& srv_to_add,
                       size_t count_limit = 3 )
{
    for (size_t ii = 0; ii < count_limit; ++ii) {
        ptr<srv_config> s_conf = srv_to_add.getTestMgr()->get_srv_config();
        ptr< cmd_result< ptr<buffer> > > ret = leader.raftServer->add_srv(*s_conf);

        std::string ret_string = "adding S" + std::to_string(s_conf->get_id());
        bool succeeded = false;

        if (ret->get_result_code() == cmd_result_code::OK) {
            succeeded = true;
        } else {
            ret_string += " failed: " + std::to_string(ret->get_result_code());
        }
        TestSuite::sleep_sec(1, ret_string);
        if (succeeded) {
            return 0;
        }
    }
    return -1;
}